

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  undefined8 in_RAX;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint match_extra;
  uint match_slot;
  
  uVar2 = *(uint *)(gProbCost +
                   (ulong)(0x800 - *(ushort *)
                                    ((long)(&this->super_state_base + 1) +
                                    (ulong)is_match_model_index * 2 + 4)) * 4);
  uVar6 = *(uint *)(gProbCost +
                   (ulong)*(ushort *)
                           ((long)this->m_lit_table +
                           (ulong)(this->super_state_base).m_cur_state * 2 + -0x7c) * 4);
  _match_extra = in_RAX;
  CLZBase::compute_lzx_position_slot(lzbase,match_dist,&match_slot,&match_extra);
  bVar1 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[match_slot];
  if (bVar1 < 3) {
    lVar9 = (ulong)bVar1 << 0x18;
  }
  else {
    uVar4 = 0;
    if (4 < bVar1) {
      uVar4 = (ulong)((uint)bVar1 * 0x1000000 + 0xfc000000);
    }
    lVar9 = (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model.
                              m_code_sizes.m_p[match_extra & 0xf] << 0x18) + uVar4;
  }
  lVar9 = (ulong)uVar6 + (ulong)uVar2 + lVar9;
  uVar2 = (this->super_state_base).m_cur_state;
  puVar3 = (this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p;
  uVar6 = min_len - 2;
  for (lVar5 = (long)min_len; lVar5 <= max_len; lVar5 = lVar5 + 1) {
    lVar7 = lVar9;
    uVar8 = uVar6;
    if (8 < lVar5) {
      lVar7 = (int)((uint)this->m_large_len_table[6 < uVar2].
                          super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p[lVar5 + -9]
                   << 0x18) + lVar9;
      uVar8 = 7;
    }
    pBitcosts[lVar5] = (int)((uint)puVar3[(uVar8 | match_slot * 8 - 8) + 2] << 0x18) + lVar7;
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      dict_pos;
      LZHAM_ASSERT(min_len >= cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += (num_extra_bits << cBitCostScaleShift);
      else
      {
         if (num_extra_bits > 4)
            cost += ((num_extra_bits - 4) << cBitCostScaleShift);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const sym_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            len_cost += large_len_table.get_cost(match_len - 9);
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }